

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::SpanContext_testFromStream_Test::TestBody(SpanContext_testFromStream_Test *this)

{
  bool bVar1;
  __pthread_internal_list *lhs;
  Message *pMVar2;
  char *pcVar3;
  FromStreamTestCase *local_9b0;
  AssertHelper local_858 [8];
  Message local_850 [8];
  undefined1 local_848 [8];
  AssertionResult gtest_ar_1;
  stringstream ss_1;
  ostream local_828 [376];
  undefined1 local_6b0 [8];
  SpanContext spanContextFromStreamOp;
  AssertHelper local_5f8 [8];
  Message local_5f0 [15];
  bool local_5e1;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar;
  stringstream local_520 [8];
  stringstream ss;
  ostream local_510 [376];
  undefined1 local_398 [8];
  SpanContext spanContext;
  FromStreamTestCase *testCase;
  FromStreamTestCase *__end1;
  FromStreamTestCase *__begin1;
  FromStreamTestCase (*__range1) [16];
  allocator local_2c0;
  allocator local_2bf;
  allocator local_2be;
  allocator local_2bd;
  allocator local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  allocator local_2b8;
  allocator local_2b7;
  allocator local_2b6;
  allocator local_2b5 [20];
  allocator local_2a1;
  string *local_2a0;
  undefined1 local_298 [8];
  FromStreamTestCase testCases [16];
  SpanContext_testFromStream_Test *this_local;
  
  __range1._4_1_ = 1;
  local_2a0 = (string *)local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_298,"",&local_2a1);
  testCases[0]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[0]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[0]._success,"abcd",local_2b5);
  testCases[1]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[1]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[1]._success,"ABCD",&local_2b6);
  testCases[2]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[2]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[2]._success,"x:1:1:1",&local_2b7);
  testCases[3]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[3]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[3]._success,"1:x:1:1",&local_2b8);
  testCases[4]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[4]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[4]._success,"1:1:x:1",&local_2b9);
  testCases[5]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[5]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&testCases[5]._success,"1:1:1:x",&local_2ba);
  testCases[6]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[6]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[6]._success,"01234567890123456789012345678901234:1:1:1",&local_2bb
            );
  testCases[7]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[7]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[7]._success,"01234567890123456789012345678901:1:1:1",&local_2bc);
  testCases[8]._input.field_2._M_local_buf[8] = '\x01';
  local_2a0 = (string *)&testCases[8]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[8]._success,"01234_67890123456789012345678901:1:1:1",&local_2bd);
  testCases[9]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[9]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[9]._success,"0123456789012345678901_345678901:1:1:1",&local_2be);
  testCases[10]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[10]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[10]._success,"1:0123456789012345:1:1",&local_2bf);
  testCases[0xb]._input.field_2._M_local_buf[8] = '\x01';
  local_2a0 = (string *)&testCases[0xb]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[0xb]._success,"1:01234567890123456:1:1",&local_2c0);
  testCases[0xc]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[0xc]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[0xc]._success,"10000000000000001:1:1:1",
             (allocator *)((long)&__range1 + 7));
  testCases[0xd]._input.field_2._M_local_buf[8] = '\x01';
  local_2a0 = (string *)&testCases[0xd]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[0xd]._success,"10000000000000001:1:1",
             (allocator *)((long)&__range1 + 6));
  testCases[0xe]._input.field_2._M_local_buf[8] = '\0';
  local_2a0 = (string *)&testCases[0xe]._success;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&testCases[0xe]._success,"1:1:1:1",(allocator *)((long)&__range1 + 5));
  testCases[0xf]._input.field_2._M_local_buf[8] = '\x01';
  __range1._4_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bf);
  std::allocator<char>::~allocator((allocator<char> *)&local_2be);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bc);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bb);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b7);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b6);
  std::allocator<char>::~allocator((allocator<char> *)local_2b5);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  for (__end1 = (FromStreamTestCase *)local_298;
      __end1 != (FromStreamTestCase *)&testCases[0xf]._success; __end1 = __end1 + 1) {
    spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)__end1;
    SpanContext::SpanContext((SpanContext *)local_398);
    std::__cxx11::stringstream::stringstream(local_520);
    std::operator<<(local_510,
                    (string *)spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next);
    jaegertracing::SpanContext::fromStream((istream *)&gtest_ar.message_);
    SpanContext::operator=((SpanContext *)local_398,(SpanContext *)&gtest_ar.message_);
    SpanContext::~SpanContext((SpanContext *)&gtest_ar.message_);
    lhs = spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next + 2;
    local_5e1 = SpanContext::isValid((SpanContext *)local_398);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_5e0,"testCase._success","spanContext.isValid()",(bool *)lhs,
               &local_5e1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
    if (!bVar1) {
      testing::Message::Message(local_5f0);
      pMVar2 = testing::Message::operator<<(local_5f0,(char (*) [7])"input=");
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)spanContext._mutex.super___mutex_base._M_mutex.__data.__list.
                                    __next);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
      testing::internal::AssertHelper::AssertHelper
                (local_5f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                 ,0x3d,pcVar3);
      testing::internal::AssertHelper::operator=(local_5f8,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(local_5f8);
      testing::Message::~Message(local_5f0);
    }
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._37_3_ = 0;
    spanContextFromStreamOp._mutex.super___mutex_base._M_mutex.__size[0x24] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
    if (spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ == 0) {
      spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ = 0;
    }
    std::__cxx11::stringstream::~stringstream(local_520);
    if (spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ == 0) {
      SpanContext::SpanContext((SpanContext *)local_6b0);
      std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_1.message_);
      std::operator<<(local_828,
                      (string *)spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next)
      ;
      operator>>((istream *)&gtest_ar_1.message_,(SpanContext *)local_6b0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_1.message_);
      testing::internal::EqHelper<false>::
      Compare<jaegertracing::SpanContext,jaegertracing::SpanContext>
                ((EqHelper<false> *)local_848,"spanContext","spanContextFromStreamOp",
                 (SpanContext *)local_398,(SpanContext *)local_6b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
      if (!bVar1) {
        testing::Message::Message(local_850);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
        testing::internal::AssertHelper::AssertHelper
                  (local_858,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/SpanContextTest.cpp"
                   ,0x48,pcVar3);
        testing::internal::AssertHelper::operator=(local_858,local_850);
        testing::internal::AssertHelper::~AssertHelper(local_858);
        testing::Message::~Message(local_850);
      }
      spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._37_3_ = 0;
      spanContextFromStreamOp._mutex.super___mutex_base._M_mutex.__size[0x24] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
      if (spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ == 0) {
        spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ = 0;
      }
      SpanContext::~SpanContext((SpanContext *)local_6b0);
    }
    SpanContext::~SpanContext((SpanContext *)local_398);
    if (spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ != 0) goto LAB_0027a68c;
  }
  spanContextFromStreamOp._mutex.super___mutex_base._M_mutex._36_4_ = 0;
LAB_0027a68c:
  local_9b0 = (FromStreamTestCase *)&testCases[0xf]._success;
  do {
    local_9b0 = local_9b0 + -1;
    anon_unknown_6::FromStreamTestCase::~FromStreamTestCase(local_9b0);
  } while (local_9b0 != (FromStreamTestCase *)local_298);
  return;
}

Assistant:

TEST(SpanContext, testFromStream)
{
    const FromStreamTestCase testCases[] = {
        { "", false },
        { "abcd", false },
        { "ABCD", false },
        { "x:1:1:1", false },
        { "1:x:1:1", false },
        { "1:1:x:1", false },
        { "1:1:1:x", false },
        { "01234567890123456789012345678901234:1:1:1", false },
        { "01234567890123456789012345678901:1:1:1", true },
        { "01234_67890123456789012345678901:1:1:1", false },
        { "0123456789012345678901_345678901:1:1:1", false },
        { "1:0123456789012345:1:1", true },
        { "1:01234567890123456:1:1", false },
        { "10000000000000001:1:1:1", true },
        { "10000000000000001:1:1", false },
        { "1:1:1:1", true }
    };

    for (auto&& testCase : testCases) {
        SpanContext spanContext;
        {
            std::stringstream ss;
            ss << testCase._input;
            spanContext = SpanContext::fromStream(ss);
            ASSERT_EQ(testCase._success, spanContext.isValid())
                << "input=" << testCase._input;
        }

        SpanContext spanContextFromStreamOp;
        {
            std::stringstream ss;
            ss << testCase._input;
            ss >> spanContextFromStreamOp;
        }

        ASSERT_EQ(spanContext, spanContextFromStreamOp);
    }
}